

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntTest.hpp
# Opt level: O2

void Qentem::Test::TestBigInt1(QTest *test)

{
  uint local_38 [2];
  
  local_38[0] = 1;
  local_38[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x53);
  local_38[0] = 8;
  local_38[1] = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x54);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x55);
  local_38[0] = 0xf;
  local_38[1] = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x56);
  local_38[0] = 8;
  local_38[1] = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x58);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x59);
  local_38[0] = 7;
  local_38[1] = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x5a);
  local_38[0] = 8;
  local_38[1] = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x5c);
  local_38[0] = 0x18;
  local_38[1] = 0x18;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x5d);
  local_38[0] = 2;
  local_38[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x5e);
  local_38[0] = 2;
  local_38[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x62);
  local_38[0] = 0x10;
  local_38[1] = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,99);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,100);
  local_38[0] = 7;
  local_38[1] = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x65);
  local_38[0] = 0x10;
  local_38[1] = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x67);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x68);
  local_38[0] = 3;
  local_38[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x69);
  local_38[0] = 0x10;
  local_38[1] = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x6b);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x6c);
  local_38[0] = 7;
  local_38[1] = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x6d);
  local_38[0] = 4;
  local_38[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x71);
  local_38[0] = 0x20;
  local_38[1] = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x72);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x73);
  local_38[0] = 3;
  local_38[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x74);
  local_38[0] = 4;
  local_38[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x76);
  local_38[0] = 0x20;
  local_38[1] = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x77);
  local_38[0] = 0x400;
  local_38[1] = 0x400;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x78);
  local_38[0] = 0x1f;
  local_38[1] = 0x1f;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x79);
  local_38[0] = 0x20;
  local_38[1] = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x7b);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x7c);
  local_38[0] = 1;
  local_38[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x7d);
  local_38[0] = 0x20;
  local_38[1] = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x7f);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x80);
  local_38[0] = 3;
  local_38[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x81);
  local_38[0] = 8;
  local_38[1] = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x85);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x86);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x87);
  local_38[0] = 1;
  local_38[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x88);
  local_38[0] = 8;
  local_38[1] = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x8a);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x8b);
  local_38[0] = 0x400;
  local_38[1] = 0x400;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x8c);
  local_38[0] = 0xf;
  local_38[1] = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x8d);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x8f);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x90);
  local_38[0] = 0;
  local_38[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x91);
  local_38[0] = 0x40;
  local_38[1] = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x93);
  local_38[0] = 0x80;
  local_38[1] = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x94);
  local_38[0] = 1;
  local_38[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_38 + 1,local_38,0x95);
  return;
}

Assistant:

static void TestBigInt1(QTest &test) {
    test.IsEqual(BigInt_8_128::SizeOfType(), 1U, __LINE__);
    test.IsEqual(BigInt_8_128::TypeWidth(), 8U, __LINE__);
    test.IsEqual(BigInt_8_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_8_128::MaxIndex(), 15U, __LINE__);

    test.IsEqual(BigInt_8_63::TypeWidth(), 8U, __LINE__);
    test.IsEqual(BigInt_8_63::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_8_63::MaxIndex(), 7U, __LINE__);

    test.IsEqual(BigInt_8_23::TypeWidth(), 8U, __LINE__);
    test.IsEqual(BigInt_8_23::TotalBits(), 24U, __LINE__);
    test.IsEqual(BigInt_8_23::MaxIndex(), 2U, __LINE__);

    //////////////////////////////

    test.IsEqual(BigInt_16_128::SizeOfType(), 2U, __LINE__);
    test.IsEqual(BigInt_16_128::TypeWidth(), 16U, __LINE__);
    test.IsEqual(BigInt_16_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_16_128::MaxIndex(), 7U, __LINE__);

    test.IsEqual(BigInt_16_63::TypeWidth(), 16U, __LINE__);
    test.IsEqual(BigInt_16_63::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_16_63::MaxIndex(), 3U, __LINE__);

    test.IsEqual(BigInt_16_120::TypeWidth(), 16U, __LINE__);
    test.IsEqual(BigInt_16_120::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_16_120::MaxIndex(), 7U, __LINE__);

    //////////////////////////////

    test.IsEqual(BigInt_32_128::SizeOfType(), 4U, __LINE__);
    test.IsEqual(BigInt_32_128::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_32_128::MaxIndex(), 3U, __LINE__);

    test.IsEqual(BigInt_32_1024::SizeOfType(), 4U, __LINE__);
    test.IsEqual(BigInt_32_1024::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_1024::TotalBits(), 1024U, __LINE__);
    test.IsEqual(BigInt_32_1024::MaxIndex(), 31U, __LINE__);

    test.IsEqual(BigInt_32_63::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_63::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_32_63::MaxIndex(), 1U, __LINE__);

    test.IsEqual(BigInt_32_120::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_120::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_32_120::MaxIndex(), 3U, __LINE__);

    //////////////////////////////

    test.IsEqual(BigInt_64_128::SizeOfType(), 8U, __LINE__);
    test.IsEqual(BigInt_64_128::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_64_128::MaxIndex(), 1U, __LINE__);

    test.IsEqual(BigInt_64_1024::SizeOfType(), 8U, __LINE__);
    test.IsEqual(BigInt_64_1024::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_1024::TotalBits(), 1024U, __LINE__);
    test.IsEqual(BigInt_64_1024::MaxIndex(), 15U, __LINE__);

    test.IsEqual(BigInt_64_15::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_15::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_64_15::MaxIndex(), 0U, __LINE__);

    test.IsEqual(BigInt_64_120::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_120::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_64_120::MaxIndex(), 1U, __LINE__);
}